

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::ImageQueryErrorsTest::iterate(ImageQueryErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 *puVar9;
  char *description;
  byte bVar10;
  qpTestResult testResult;
  ErrorsUtilities *pEVar11;
  TestContext *this_00;
  uint uVar12;
  GLuint texture_2D;
  GLuint texture_2D_compressed;
  GLuint buffer;
  byte local_1e1;
  byte local_1e0;
  byte local_1df;
  byte local_1de;
  byte local_1dd;
  byte local_1dc;
  byte local_1db;
  byte local_1da;
  byte local_1d9;
  byte local_1d8;
  byte local_1d7;
  byte local_1d6;
  byte local_1d5;
  byte local_1d4;
  byte local_1d3;
  byte local_1d2;
  byte local_1d1;
  GLuint texture_rectangle;
  GLuint texture_cube;
  GLuint texture_2D_stencil;
  GLuint texture_2D_ms;
  GLint max_level;
  GLuint texture_2D_int;
  char store [384];
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    buffer = 0;
    texture_2D = 0;
    texture_2D_int = 0;
    texture_2D_ms = 0;
    texture_2D_stencil = 0;
    texture_2D_compressed = 0;
    texture_cube = 0;
    texture_rectangle = 0;
    max_level = 0;
    memset(store,0,0x180);
    (**(code **)(lVar8 + 0x3b8))(1,&buffer);
    (**(code **)(lVar8 + 0xec0))(buffer,0x41,0,0x88e6);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glNamedBufferData has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30c4);
    (**(code **)(lVar8 + 0x6f8))(1,&texture_2D);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30c8);
    (**(code **)(lVar8 + 0xb8))(0xde1,texture_2D);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30cb);
    (**(code **)(lVar8 + 0x1310))(0xde1,0,0x8229,4,4,0,0x1903,0x1405,s_reference_data);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30cf);
    (**(code **)(lVar8 + 0x6f8))(1,&texture_2D);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30d3);
    (**(code **)(lVar8 + 0xb8))(0xde1,texture_2D);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30d6);
    (**(code **)(lVar8 + 0x1310))(0xde1,0,0x8229,4,4,0,0x1903,0x1405,s_reference_data);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30da);
    (**(code **)(lVar8 + 0x6f8))(1,&texture_cube);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30de);
    (**(code **)(lVar8 + 0xb8))(0x8513,texture_cube);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30e1);
    (**(code **)(lVar8 + 0x1310))(0x8515,0,0x8229,4,4,0,0x1903,0x1405,s_reference_data);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30e5);
    (**(code **)(lVar8 + 0x400))(0x9100,1,&texture_2D_ms);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30e9);
    (**(code **)(lVar8 + 0x1460))(texture_2D_ms,1,0x8229,4,4,0);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glTextureStorage2DMultisample has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30ed);
    (**(code **)(lVar8 + 0x400))(0xde1,1,&texture_2D_stencil);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30f1);
    (**(code **)(lVar8 + 0x1450))(texture_2D_stencil,1,0x8d48,4,4);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glTextureStorage2DMultisample has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30f4);
    (**(code **)(lVar8 + 0x6f8))(1,&texture_2D_compressed);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30f8);
    (**(code **)(lVar8 + 0xb8))(0xde1,texture_2D_compressed);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30fb);
    (**(code **)(lVar8 + 0x1310))(0xde1,0,0x8dbb,4,4,0,0x1903,0x1405,s_reference_data);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x30ff);
    (**(code **)(lVar8 + 0x868))(0xd33,&max_level);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3102);
    (**(code **)(lVar8 + 0x6f8))(1,&texture_rectangle);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3106);
    (**(code **)(lVar8 + 0xb8))(0x84f5,texture_rectangle);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3109);
    (**(code **)(lVar8 + 0x1310))(0x84f5,0,0x8229,4,4,0,0x1903,0x1405,s_reference_data);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x310d);
    uVar12 = 0;
    do {
      uVar12 = uVar12 + 1;
      cVar3 = (**(code **)(lVar8 + 0xcc8))(uVar12);
    } while (cVar3 != '\0');
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D_ms;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x1903,0x1405,0x40,store);
    bVar1 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar11,(this->super_TestCase).m_context,0x500,"glGetTextureImage",
                       "resulting texture target is not an accepted value TEXTURE_1D, TEXTURE_2D, TEXTURE_3D, TEXTURE_1D_ARRAY, TEXTURE_2D_ARRAY, TEXTURE_CUBE_MAP_ARRAY, TEXTURE_RECTANGLE, and TEXTURE_CUBE_MAP."
                      );
    pEVar11 = (ErrorsUtilities *)(ulong)uVar12;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x1903,0x1405,0x40,store);
    local_1d1 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           "texture is not the name of an existing texture object.");
    pEVar11 = (ErrorsUtilities *)(ulong)texture_cube;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x1903,0x1405,0x180,store);
    local_1d2 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           "the effective target is TEXTURE_CUBE_MAP and the texture object is not cube complete or cube array complete, respectively."
                          );
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0xffffffff,0x1903,0x1405,0x40,store);
    local_1d3 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x501,"glGetTextureImage",
                           "level is less than 0.");
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D;
    (**(code **)(lVar8 + 0xad8))(pEVar11,max_level,0x1903,0x1405,0x40,store);
    local_1d4 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x501,"glGetTextureImage",
                           "level is larger than the maximum allowable level.");
    pEVar11 = (ErrorsUtilities *)(ulong)texture_rectangle;
    (**(code **)(lVar8 + 0xad8))(pEVar11,1,0x1903,0x1405,0x40,store);
    local_1d5 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x501,"glGetTextureImage",
                           "level is non-zero and the effective target is TEXTURE_RECTANGLE.");
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D_stencil;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x1903,0x1405,0x40,store);
    local_1d6 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           "format is a color format (one of the formats in table 8.3 whose target is the color buffer) and the base internal format of the texture image is not a color format."
                          );
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x1902,0x1405,0x40,store);
    local_1d7 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           "format is DEPTH_COMPONENT and the base internal format is not DEPTH_COMPONENT or DEPTH_STENCIL."
                          );
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x84f9,0x84fa,0x40,store);
    local_1d8 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           "format is DEPTH_STENCIL and the base internal format is not DEPTH_STENCIL."
                          );
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x1901,0x1405,0x40,store);
    local_1d9 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           "format is STENCIL_INDEX and the base internal format is not STENCIL_INDEX or DEPTH_STENCIL."
                          );
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x8d94,0x1405,0x40,store);
    local_1da = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           "format is one of the integer formats in table 8.3 and the internal format of the texture image is not integer."
                          );
    pEVar11 = (ErrorsUtilities *)0x0;
    (**(code **)(lVar8 + 0xad8))(0,0,0x1903,0x1405,0x40,store);
    local_1db = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           "format is not one of the integer formats in table 8.3 and the internal format is integer."
                          );
    (**(code **)(lVar8 + 0x40))(0x88eb,buffer);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x316e);
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x1903,0x1405,0x40,4);
    local_1dc = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           anon_var_dwarf_8a3995);
    (**(code **)(lVar8 + 0x40))(0x88eb,0);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3177);
    (**(code **)(lVar8 + 0x40))(0x88eb,buffer);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x317e);
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x1903,0x1405,0x40,1);
    local_1dd = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           "a pixel pack buffer object is bound and pixels is not evenly divisible by the number of basic machine units needed to store in memory the GL data type corresponding to type (see table 8.2)."
                          );
    (**(code **)(lVar8 + 0x40))(0x88eb,0);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3188);
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D;
    (**(code **)(lVar8 + 0xad8))(pEVar11,0,0x1903,0x1405,0x3c,store);
    local_1de = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,"glGetTextureImage",
                           "the buffer size required to store the requested data is greater than bufSize."
                          );
    pEVar11 = (ErrorsUtilities *)(ulong)uVar12;
    (**(code **)(lVar8 + 2000))(pEVar11,0,0x40,store);
    local_1df = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x502,
                           "glGetCompressedTextureImage",
                           "texture is not the name of an existing texture object.");
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D_compressed;
    (**(code **)(lVar8 + 2000))(pEVar11,0xffffffff,0x40,store);
    local_1e0 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x501,
                           "glGetCompressedTextureImage","level is less than zero.");
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D_compressed;
    (**(code **)(lVar8 + 2000))(pEVar11,max_level,0x40,store);
    local_1e1 = ErrorsUtilities::CheckErrorAndLog
                          (pEVar11,(this->super_TestCase).m_context,0x501,
                           "glGetCompressedTextureImage",
                           "level is greater than the maximum number of LODs permitted by the implementation."
                          );
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D;
    (**(code **)(lVar8 + 2000))(pEVar11,0,0x40,store);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar11,(this->super_TestCase).m_context,0x502,"glGetCompressedTextureImage",
                       "the function is used to retrieve a texture that is in an uncompressed internal format."
                      );
    (**(code **)(lVar8 + 0x40))(0x88eb,buffer);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x31b1);
    (**(code **)(lVar8 + 0xcf8))(0x88eb,0x88ba);
    iVar6 = (**(code **)(lVar8 + 0x800))();
    if (iVar6 != 0) {
      puVar9 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar9 = 0;
      __cxa_throw(puVar9,&int::typeinfo,0);
    }
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D_compressed;
    (**(code **)(lVar8 + 2000))(pEVar11,0,0x40,0);
    bVar4 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar11,(this->super_TestCase).m_context,0x502,"glGetCompressedTextureImage",
                       "a non-zero buffer object name is bound to the PIXEL_PACK_BUFFER target, the buffer storage was not initialized with BufferStorage using MAP_PERSISTENT_BIT flag, and the buffer object\'s data store is currently mapped."
                      );
    (**(code **)(lVar8 + 0x1670))(0x88eb);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glUnmapBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x31be);
    (**(code **)(lVar8 + 0x40))(0x88eb,0);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x31c6);
    (**(code **)(lVar8 + 0x40))(0x88eb,buffer);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x31cd);
    pEVar11 = (ErrorsUtilities *)(ulong)texture_2D_compressed;
    (**(code **)(lVar8 + 2000))(pEVar11,0,0x40,0x3f);
    bVar5 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar11,(this->super_TestCase).m_context,0x502,"glGetCompressedTextureImage",
                       "a non-zero buffer object name is bound to the PIXEL_PACK_BUFFER target and the data would be packed to the buffer object such that the memory writes required would exceed the data store size."
                      );
    (**(code **)(lVar8 + 0x40))(0x88eb,0);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x31d6);
    bVar10 = bVar1 & local_1d1 & local_1d2 & local_1d3 & local_1d4 & local_1d5 & local_1d6 &
             local_1d7 & local_1d8 & local_1d9 & local_1da & local_1db & local_1dc & local_1dd &
             local_1de & local_1df & local_1e0 & local_1e1;
    if (buffer != 0) {
      (**(code **)(lVar8 + 0x438))(1);
    }
    if (texture_2D != 0) {
      (**(code **)(lVar8 + 0x480))(1);
    }
    if (texture_2D_int != 0) {
      (**(code **)(lVar8 + 0x480))(1);
    }
    if (texture_2D_stencil != 0) {
      (**(code **)(lVar8 + 0x480))(1);
    }
    if (texture_2D_ms != 0) {
      (**(code **)(lVar8 + 0x480))(1);
    }
    if (texture_2D_compressed != 0) {
      (**(code **)(lVar8 + 0x480))(1);
    }
    if (texture_cube != 0) {
      (**(code **)(lVar8 + 0x480))(1);
    }
    if (texture_rectangle != 0) {
      (**(code **)(lVar8 + 0x480))(1);
    }
    do {
      iVar6 = (**(code **)(lVar8 + 0x800))();
    } while (iVar6 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bVar10 & bVar2 & bVar4 & bVar5) == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ImageQueryErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint buffer										  = 0;
	glw::GLuint texture_invalid								  = 0;
	glw::GLuint texture_2D									  = 0;
	glw::GLuint texture_2D_int								  = 0;
	glw::GLuint texture_2D_ms								  = 0;
	glw::GLuint texture_2D_stencil							  = 0;
	glw::GLuint texture_2D_compressed						  = 0;
	glw::GLuint texture_cube								  = 0;
	glw::GLuint texture_rectangle							  = 0;
	glw::GLint  max_level									  = 0;
	char		store[s_reference_size * 6 /* for cubemap */] = {};

	try
	{
		/* Preparations. */

		/* Buffer. */
		gl.createBuffers(1, &buffer);

		gl.namedBufferData(buffer, s_reference_size + 1, NULL, GL_STATIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData has failed");

		/* 2D texture */
		gl.genTextures(1, &texture_2D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_2D, texture_2D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texImage2D(GL_TEXTURE_2D, 0, s_reference_internalformat, s_reference_width, s_reference_height, 0,
					  s_reference_format, s_reference_type, s_reference_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		/* 2D texture */
		gl.genTextures(1, &texture_2D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_2D, texture_2D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texImage2D(GL_TEXTURE_2D, 0, s_reference_internalformat, s_reference_width, s_reference_height, 0,
					  s_reference_format, s_reference_type, s_reference_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		/* incomplete cube map */
		gl.genTextures(1, &texture_cube);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_CUBE_MAP, texture_cube);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, s_reference_internalformat, s_reference_width,
					  s_reference_height, 0, s_reference_format, s_reference_type, s_reference_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		/* 2D multisample */
		gl.createTextures(GL_TEXTURE_2D_MULTISAMPLE, 1, &texture_2D_ms);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.textureStorage2DMultisample(texture_2D_ms, 1, s_reference_internalformat, s_reference_width,
									   s_reference_height, false);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureStorage2DMultisample has failed");

		/* 2D stencil */
		gl.createTextures(GL_TEXTURE_2D, 1, &texture_2D_stencil);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.textureStorage2D(texture_2D_stencil, 1, GL_STENCIL_INDEX8, s_reference_width, s_reference_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureStorage2DMultisample has failed");

		/* 2D compressed texture  */
		gl.genTextures(1, &texture_2D_compressed);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_2D, texture_2D_compressed);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texImage2D(GL_TEXTURE_2D, 0, s_reference_internalformat_compressed, s_reference_width, s_reference_height, 0,
					  s_reference_format, s_reference_type, s_reference_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &max_level); /* assuming that x > log(x) */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

		/* Rectangle texture */
		gl.genTextures(1, &texture_rectangle);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_RECTANGLE, texture_rectangle);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texImage2D(GL_TEXTURE_RECTANGLE, 0, s_reference_internalformat, s_reference_width, s_reference_height, 0,
					  s_reference_format, s_reference_type, s_reference_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		/* invalid texture */
		while (gl.isTexture(++texture_invalid))
			;

		/* Tests. */

		/* Check that INVALID_ENUM is generated by GetTextureImage functions if
		 resulting texture target is not an accepted value TEXTURE_1D,
		 TEXTURE_2D, TEXTURE_3D, TEXTURE_1D_ARRAY, TEXTURE_2D_ARRAY,
		 TEXTURE_CUBE_MAP_ARRAY, TEXTURE_RECTANGLE, and TEXTURE_CUBE_MAP. */
		gl.getTextureImage(texture_2D_ms, 0, s_reference_format, s_reference_type, s_reference_size, store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureImage",
								  "resulting texture target is not an accepted value TEXTURE_1D, TEXTURE_2D, "
								  "TEXTURE_3D, TEXTURE_1D_ARRAY, TEXTURE_2D_ARRAY, TEXTURE_CUBE_MAP_ARRAY, "
								  "TEXTURE_RECTANGLE, and TEXTURE_CUBE_MAP.");

		/* Check that INVALID_OPERATION is generated by GetTextureImage
		 if texture is not the name of an existing texture object. */
		gl.getTextureImage(texture_invalid, 0, s_reference_format, s_reference_type, s_reference_size, store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureImage",
								  "texture is not the name of an existing texture object.");

		/* Check that INVALID_OPERATION error is generated by GetTextureImage if
		 the effective target is TEXTURE_CUBE_MAP or TEXTURE_CUBE_MAP_ARRAY, and
		 the texture object is not cube complete or cube array complete,
		 respectively. */
		gl.getTextureImage(texture_cube, 0, s_reference_format, s_reference_type, s_reference_size * 6, store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureImage",
								  "the effective target is TEXTURE_CUBE_MAP and the texture object is not cube "
								  "complete or cube array complete, respectively.");

		/* Check that GL_INVALID_VALUE is generated if level is less than 0 or
		 larger than the maximum allowable level. */
		gl.getTextureImage(texture_2D, -1, s_reference_format, s_reference_type, s_reference_size, store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureImage", "level is less than 0.");

		gl.getTextureImage(texture_2D, max_level, s_reference_format, s_reference_type, s_reference_size, store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureImage",
								  "level is larger than the maximum allowable level.");

		/* Check that INVALID_VALUE error is generated if level is non-zero and the
		 effective target is TEXTURE_RECTANGLE. */
		gl.getTextureImage(texture_rectangle, 1, s_reference_format, s_reference_type, s_reference_size, store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureImage",
								  "level is non-zero and the effective target is TEXTURE_RECTANGLE.");

		/* Check that INVALID_OPERATION error is generated if any of the following
		 mismatches between format and the internal format of the texture image
		 exist:
		 -  format is a color format (one of the formats in table 8.3 whose
		 target is the color buffer) and the base internal format of the
		 texture image is not a color format.
		 -  format is DEPTH_COMPONENT and the base internal format is  not
		 DEPTH_COMPONENT or DEPTH_STENCIL
		 -  format is DEPTH_STENCIL and the base internal format is not
		 DEPTH_STENCIL
		 -  format is STENCIL_INDEX and the base internal format is not
		 STENCIL_INDEX or DEPTH_STENCIL
		 -  format is one of the integer formats in table 8.3 and the internal
		 format of the texture image is not integer, or format is not one of
		 the integer formats in table 8.3 and the internal format is integer. */
		gl.getTextureImage(texture_2D_stencil, 0, s_reference_format /* red */, s_reference_type, s_reference_size,
						   store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureImage",
								  "format is a color format (one of the formats in table 8.3 whose target is the color "
								  "buffer) and the base internal format of the texture image is not a color format.");

		gl.getTextureImage(texture_2D, 0, GL_DEPTH_COMPONENT, s_reference_type, s_reference_size, store);
		is_ok &= CheckErrorAndLog(
			m_context, GL_INVALID_OPERATION, "glGetTextureImage",
			"format is DEPTH_COMPONENT and the base internal format is not DEPTH_COMPONENT or DEPTH_STENCIL.");

		gl.getTextureImage(texture_2D, 0, GL_DEPTH_STENCIL, GL_UNSIGNED_INT_24_8, s_reference_size, store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureImage",
								  "format is DEPTH_STENCIL and the base internal format is not DEPTH_STENCIL.");

		gl.getTextureImage(texture_2D, 0, GL_STENCIL_INDEX, s_reference_type, s_reference_size, store);
		is_ok &= CheckErrorAndLog(
			m_context, GL_INVALID_OPERATION, "glGetTextureImage",
			"format is STENCIL_INDEX and the base internal format is not STENCIL_INDEX or DEPTH_STENCIL.");

		gl.getTextureImage(texture_2D, 0, GL_RED_INTEGER, s_reference_type, s_reference_size, store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureImage",
								  "format is one of the integer formats in table 8.3 and the internal format of the "
								  "texture image is not integer.");

		gl.getTextureImage(texture_2D_int, 0, GL_RED, s_reference_type, s_reference_size, store);
		is_ok &= CheckErrorAndLog(
			m_context, GL_INVALID_OPERATION, "glGetTextureImage",
			"format is not one of the integer formats in table 8.3 and the internal format is integer.");

		/* Check that INVALID_OPERATION error is generated if a pixel pack buffer
		 object is bound and packing the texture image into the buffer’s memory
		 would exceed the size of the buffer. */
		gl.bindBuffer(GL_PIXEL_PACK_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

		gl.getTextureImage(texture_2D, 0, s_reference_format, s_reference_type, s_reference_size,
						   (glw::GLuint*)NULL + 1);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureImage",
								  "a pixel pack buffer object is bound and packing the texture image into the buffer’s "
								  "memory would exceed the size of the buffer.");

		gl.bindBuffer(GL_PIXEL_PACK_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

		/* Check that INVALID_OPERATION error is generated if a pixel pack buffer
		 object is bound and pixels is not evenly divisible by the number of
		 basic machine units needed to store in memory the GL data type
		 corresponding to type (see table 8.2). */
		gl.bindBuffer(GL_PIXEL_PACK_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

		gl.getTextureImage(texture_2D, 0, s_reference_format, s_reference_type, s_reference_size,
						   (glw::GLubyte*)NULL + 1);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureImage",
								  "a pixel pack buffer object is bound and pixels is not evenly divisible by the "
								  "number of basic machine units needed to store in memory the GL data type "
								  "corresponding to type (see table 8.2).");

		gl.bindBuffer(GL_PIXEL_PACK_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

		/* Check that INVALID_OPERATION error is generated by GetTextureImage if
		 the buffer size required to store the requested data is greater than
		 bufSize. */
		gl.getTextureImage(texture_2D, 0, s_reference_format, s_reference_type,
						   s_reference_size - sizeof(s_reference_data[0]), store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureImage",
								  "the buffer size required to store the requested data is greater than bufSize.");

		/* Check that INVALID_OPERATION is generated by GetCompressedTextureImage
		 if texture is not the name of an existing texture object. */
		gl.getCompressedTextureImage(texture_invalid, 0, s_reference_size, store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetCompressedTextureImage",
								  "texture is not the name of an existing texture object.");

		/* Check that INVALID_VALUE is generated by GetCompressedTextureImage if
		 level is less than zero or greater than the maximum number of LODs
		 permitted by the implementation. */
		gl.getCompressedTextureImage(texture_2D_compressed, -1, s_reference_size, store);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetCompressedTextureImage", "level is less than zero.");

		gl.getCompressedTextureImage(texture_2D_compressed, max_level, s_reference_size, store);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetCompressedTextureImage",
								  "level is greater than the maximum number of LODs permitted by the implementation.");

		/* Check that INVALID_OPERATION is generated if GetCompressedTextureImage
		 is used to retrieve a texture that is in an uncompressed internal
		 format. */
		gl.getCompressedTextureImage(texture_2D, 0, s_reference_size, store);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetCompressedTextureImage",
							 "the function is used to retrieve a texture that is in an uncompressed internal format.");

		/* Check that INVALID_OPERATION is generated by GetCompressedTextureImage
		 if a non-zero buffer object name is bound to the PIXEL_PACK_BUFFER
		 target, the buffer storage was not initialized with BufferStorage using
		 MAP_PERSISTENT_BIT flag, and the buffer object's data store is currently
		 mapped. */
		gl.bindBuffer(GL_PIXEL_PACK_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

		gl.mapBuffer(GL_PIXEL_PACK_BUFFER, GL_READ_WRITE);

		if (GL_NO_ERROR == gl.getError())
		{
			gl.getCompressedTextureImage(texture_2D_compressed, 0, s_reference_size, NULL);
			is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetCompressedTextureImage",
									  "a non-zero buffer object name is bound to the PIXEL_PACK_BUFFER target, the "
									  "buffer storage was not initialized with BufferStorage using MAP_PERSISTENT_BIT "
									  "flag, and the buffer object's data store is currently mapped.");

			gl.unmapBuffer(GL_PIXEL_PACK_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer has failed");
		}
		else
		{
			throw 0;
		}

		gl.bindBuffer(GL_PIXEL_PACK_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

		/* Check that INVALID_OPERATION is generated by GetCompressedTextureImage
		 if a non-zero buffer object name is bound to the PIXEL_PACK_BUFFER
		 target and the data would be packed to the buffer object such that the
		 memory writes required would exceed the data store size. */
		gl.bindBuffer(GL_PIXEL_PACK_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

		gl.getCompressedTextureImage(texture_2D_compressed, 0, s_reference_size, (char*)NULL + s_reference_size - 1);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetCompressedTextureImage",
								  "a non-zero buffer object name is bound to the PIXEL_PACK_BUFFER target and the data "
								  "would be packed to the buffer object such that the memory writes required would "
								  "exceed the data store size.");

		gl.bindBuffer(GL_PIXEL_PACK_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
	}

	if (texture_2D)
	{
		gl.deleteTextures(1, &texture_2D);
	}

	if (texture_2D_int)
	{
		gl.deleteTextures(1, &texture_2D_int);
	}

	if (texture_2D_stencil)
	{
		gl.deleteTextures(1, &texture_2D_stencil);
	}

	if (texture_2D_ms)
	{
		gl.deleteTextures(1, &texture_2D_ms);
	}

	if (texture_2D_compressed)
	{
		gl.deleteTextures(1, &texture_2D_compressed);
	}

	if (texture_cube)
	{
		gl.deleteTextures(1, &texture_cube);
	}

	if (texture_rectangle)
	{
		gl.deleteTextures(1, &texture_rectangle);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}